

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O1

uint16_t udata_getInfoSize_63(UDataInfo *info)

{
  ushort uVar1;
  ushort uVar2;
  
  if (info != (UDataInfo *)0x0) {
    uVar1 = info->size;
    uVar2 = uVar1 << 8 | uVar1 >> 8;
    if (info->isBigEndian == '\0') {
      uVar2 = uVar1;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

U_CFUNC uint16_t
udata_getInfoSize(const UDataInfo *info) {
    if(info==NULL) {
        return 0;
    } else if(info->isBigEndian==U_IS_BIG_ENDIAN) {
        /* same endianness */
        return info->size;
    } else {
        /* opposite endianness */
        uint16_t x=info->size;
        return (uint16_t)((x<<8)|(x>>8));
    }
}